

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O3

void __thiscall Enterprise::Nick::output_attributed<4>(Nick *this,uint16_t *target,int columns)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  int iVar4;
  uint16_t palette [2];
  
  if (0 < columns) {
    puVar3 = this->ram_;
    iVar4 = 0;
    do {
      bVar1 = puVar3[(uint)this->line_data_pointer_[1] + iVar4 & 0xffff];
      bVar2 = puVar3[*(int *)this->line_data_pointer_ + iVar4 & 0xffff];
      this->last_read_ = bVar1;
      palette[0] = this->palette_[bVar2 >> 4];
      palette[1] = this->palette_[bVar2 & 0xf];
      *target = palette[bVar1 >> 7];
      target[1] = *(uint16_t *)((long)palette + (ulong)(bVar1 >> 5 & 2));
      target[2] = *(uint16_t *)((long)palette + (ulong)(bVar1 >> 4 & 2));
      target[3] = *(uint16_t *)((long)palette + (ulong)(bVar1 >> 3 & 2));
      target[4] = *(uint16_t *)((long)palette + (ulong)(bVar1 >> 2 & 2));
      target[5] = *(uint16_t *)((long)palette + (ulong)(bVar1 >> 1 & 2));
      target[6] = *(uint16_t *)((long)palette + (ulong)(bVar1 & 2));
      target[7] = palette[bVar1 & 1];
      target = target + 8;
      iVar4 = iVar4 + 1;
    } while (columns != iVar4);
  }
  return;
}

Assistant:

void Nick::output_attributed(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	for(int c = 0; c < columns; c++) {
		const uint8_t pixels = ram_[(line_data_pointer_[1] + c) & 0xffff];
		const uint8_t attributes = ram_[(line_data_pointer_[0] + c) & 0xffff];
		last_read_ = pixels;

		const uint16_t palette[2] = {
			palette_[attributes >> 4], palette_[attributes & 0x0f]
		};
		output1bpp(pixels);
	}
}